

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O1

Face __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::removeInsertedVertex
          (SignpostIntrinsicTriangulation *this,Vertex v)

{
  ulong uVar1;
  Etype firstE_;
  Vertex v_00;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  ParentMeshT *pPVar7;
  ulong *puVar8;
  byte bVar9;
  ulong uVar10;
  unsigned_long uVar11;
  Edge e;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> f;
  undefined1 auVar12 [16];
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_e8;
  Vertex local_b0;
  ulong local_a0;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_98;
  
  local_b0.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  ind = v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
  ;
  local_b0.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
         mesh;
  if (((this->vertexLocations).data.
       super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
       .m_storage.m_data
       [local_b0.
        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind].
       type != Vertex) && (bVar4 = isOnFixedEdge(this,v), !bVar4)) {
    local_a0 = 0;
    do {
      sVar6 = Vertex::degree(&local_b0);
      if (sVar6 == 3) {
        sVar6 = Vertex::degree(&local_b0);
        if (sVar6 == 3) {
          v_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = local_b0.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .ind;
          v_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = local_b0.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          f = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
              ManifoldSurfaceMesh::removeVertex
                        ((this->intrinsicMesh)._M_t.
                         super___uniq_ptr_impl<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                         .
                         super__Head_base<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_false>
                         ._M_head_impl,v_00);
          updateFaceBasis(this,(Face)f);
          auVar12._0_8_ = f.mesh;
          auVar12._8_8_ = f.ind;
          return (Face)auVar12;
        }
        break;
      }
      local_e8.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           ((local_b0.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start
           [local_b0.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind];
      local_e8.state.currE.useImplicitTwin =
           (local_b0.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           mesh)->useImplicitTwinFlag;
      local_e8.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_b0.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             mesh;
      local_e8.state.currE.processingIncoming = false;
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh.
      _0_1_ = SUB81(local_b0.
                    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                    .mesh,0);
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh.
      _1_7_ = (undefined7)
              ((ulong)local_b0.
                      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                      .mesh >> 8);
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind.
      _0_1_ = (undefined1)
              local_e8.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind;
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind.
      _1_7_ = (undefined7)
              (local_e8.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind >> 8);
      firstE_.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_b0.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             mesh;
      firstE_.useImplicitTwin =
           (local_b0.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           mesh)->useImplicitTwinFlag;
      firstE_._1_7_ = local_e8.state.currE._1_7_;
      firstE_.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_e8.state.currE.currHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      firstE_._24_8_ = (ulong)(uint7)local_e8.state.currE._25_7_ << 8;
      firstE_.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_b0.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             mesh;
      firstE_.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_e8.state.currE.currHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::NavigationSetBase
                (&local_98,firstE_);
      bVar3 = local_98.cachedEndIter.justStarted;
      bVar4 = local_98.cachedEndIter.state.currE.processingIncoming;
      sVar6 = local_98.cachedEndIter.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind;
      local_e8.state.currE.useImplicitTwin = local_98.firstE.useImplicitTwin;
      local_e8.state.currE._1_7_ = local_98.firstE._1_7_;
      uVar2 = local_e8.state.currE._0_8_;
      local_e8.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_98.firstE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind.
      _1_7_ = local_98.firstE.firstHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind._1_7_;
      local_e8.state.currE._25_7_ = local_98.firstE._25_7_;
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh.
      _0_1_ = local_98.firstE.firstHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh._0_1_;
      local_e8.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind.
      _0_1_ = (undefined1)
              local_98.firstE.firstHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind;
      local_e8.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_98.firstE.currHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      local_e8.state.currE.processingIncoming = local_98.firstE.processingIncoming;
      local_e8.justStarted = true;
      local_e8.state.currE.useImplicitTwin = local_98.firstE.useImplicitTwin;
      pPVar7 = local_98.firstE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh;
      bVar9 = local_98.firstE.processingIncoming;
      if (local_e8.state.currE.useImplicitTwin == false) {
        do {
          bVar5 = pPVar7->useImplicitTwinFlag;
          if (bVar5 == true) {
            uVar10 = local_e8.state.currE.currHe.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind >> 1;
          }
          else {
            uVar10 = (pPVar7->heEdgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [local_e8.state.currE.currHe.
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .ind];
          }
          if (bVar5 == false) {
            uVar11 = (pPVar7->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
          }
          else {
            uVar11 = uVar10 * 2;
          }
          if (local_e8.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind == uVar11) goto LAB_001a2729;
          if ((bVar9 & 1) == 0) {
            puVar8 = (pPVar7->heVertOutNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     local_e8.state.currE.currHe.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind;
            if (bVar5 != false) {
              puVar8 = (pPVar7->heNextArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       (local_e8.state.currE.currHe.
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .ind ^ 1);
            }
            local_e8.state.currE.currHe.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = *puVar8;
            uVar10 = CONCAT71(local_e8.state.currE.firstHe.
                              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                              .ind._1_7_,
                              (undefined1)
                              local_e8.state.currE.firstHe.
                              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                              .ind);
            if (local_e8.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind == uVar10) {
              local_e8.state.currE.processingIncoming = true;
              uVar1 = uVar10;
              do {
                local_e8.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind = uVar1;
                uVar1 = *(ulong *)(*(long *)(CONCAT71(local_98.firstE.firstHe.
                                                                                                            
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._1_7_,
                                                  local_e8.state.currE.firstHe.
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._0_1_) + 0xf8) +
                                  local_e8.state.currE.currHe.
                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                  .ind * 8);
              } while (uVar1 != uVar10);
              bVar9 = 1;
              goto LAB_001a26fe;
            }
          }
          else {
            if (bVar5 == false) {
              local_e8.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind = (pPVar7->heVertInNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [local_e8.state.currE.currHe.
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .ind];
            }
            else {
              local_e8.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind = (pPVar7->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [local_e8.state.currE.currHe.
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .ind] ^ 1;
            }
            if (local_e8.state.currE.currHe.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind == CONCAT71(local_e8.state.currE.firstHe.
                                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                 .ind._1_7_,
                                 (undefined1)
                                 local_e8.state.currE.firstHe.
                                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                 .ind)) {
              local_e8.state.currE.processingIncoming = false;
              local_e8.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind = *(ulong *)(*(long *)(CONCAT71(local_98.firstE.firstHe.
                                                                                                      
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._1_7_,
                                                  local_e8.state.currE.firstHe.
                                                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                                  .mesh._0_1_) + 0xf8) +
                               CONCAT71(local_e8.state.currE.firstHe.
                                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                        .ind._1_7_,
                                        (undefined1)
                                        local_e8.state.currE.firstHe.
                                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                        .ind) * 8);
              bVar9 = 0;
LAB_001a26fe:
              pPVar7 = (ParentMeshT *)
                       CONCAT71(local_98.firstE.firstHe.
                                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                .mesh._1_7_,
                                local_e8.state.currE.firstHe.
                                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                .mesh._0_1_);
              local_e8.state.currE.firstHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind._0_1_ = (undefined1)
                           local_e8.state.currE.currHe.
                           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                           .ind;
              local_e8.state.currE.firstHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind._1_7_ = (undefined7)
                           (local_e8.state.currE.currHe.
                            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .ind >> 8);
              local_e8.state.currE.currHe.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh = pPVar7;
            }
          }
        } while ((local_e8.state.currE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind != local_98.firstE.currHe.
                          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .ind) || ((bool)bVar9 != local_98.firstE.processingIncoming));
        local_e8.justStarted = false;
      }
LAB_001a2729:
      bVar5 = false;
      local_e8.state.currE._0_8_ = uVar2;
      while (((local_e8.justStarted != bVar3 ||
              (local_e8.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind != sVar6)) || (local_e8.state.currE.processingIncoming != bVar4))) {
        if ((local_e8.state.currE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->useImplicitTwinFlag == true) {
          uVar10 = local_e8.state.currE.currHe.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind >> 1;
        }
        else {
          uVar10 = ((local_e8.state.currE.currHe.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh)->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [local_e8.state.currE.currHe.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .ind];
        }
        e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
             uVar10;
        e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
             = local_e8.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        bVar5 = flipEdgeIfPossible(this,e,1e-06);
        if (bVar5) break;
        NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator++
                  (&local_e8);
      }
      if (bVar5 == false) {
        bVar4 = false;
      }
      else {
        sVar6 = Vertex::degree(&local_b0);
        bVar4 = local_a0 <= sVar6 * 10;
        local_a0 = local_a0 + bVar4;
      }
    } while (bVar4);
  }
  return (Face)(Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               (ZEXT816(0xffffffffffffffff) << 0x40);
}

Assistant:

Face SignpostIntrinsicTriangulation::removeInsertedVertex(Vertex v) {
  // Strategy: flip edges until the vertex has degree three, then remove by replacing with a single face
  // TODO needs a proof that this always works... what about self edges, etc? Seems to work well.

  // What about starting with degree < 3? Since this vertex necessarily has angle sum 2PI, this could only happen in the
  // case of degree 2, with exactly degenerate triangles. Since we assume non-degenerate triangles throughout, we'll
  // consider that to not happen.

  if (vertexLocations[v].type == SurfacePointType::Vertex) return Face(); // can't remove original vertices

  if (isOnFixedEdge(v)) {
    return Face(); // don't try to remove boundary vertices, for now at least
  }

  // Flip edges until
  size_t iterCount = 0;
  while (v.degree() != 3) {

    // Find any edge we can flip
    bool anyFlipped = false;
    for (Edge e : v.adjacentEdges()) {
      anyFlipped = flipEdgeIfPossible(e);
      if (anyFlipped) break;
    }

    // failsafe, in case we get numerically stuck, or there are too many fixed edges (or the algorithm is broken)
    if (!anyFlipped || iterCount > 10 * v.degree()) {
      return Face();
    }

    iterCount++;
  }

  // give up if something went wrong (eg. flipped edges)
  if (v.degree() != 3) return Face();

  // Remove the vertex
  Face newF = intrinsicMesh->removeVertex(v);
  updateFaceBasis(newF);
  return newF;
}